

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSAify.cpp
# Opt level: O2

void __thiscall wasm::SSAify::computeGetsAndPhis(SSAify *this,LocalGraph *graph)

{
  Locations *this_00;
  array<wasm::LocalSet_*,_2UL> *this_01;
  SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
  *get;
  _Base_ptr p_Var1;
  LocalSet *pLVar2;
  SSAify *pSVar3;
  bool bVar4;
  Index index;
  _Rb_tree_const_iterator<wasm::LocalSet_*> _Var5;
  SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
  *this_02;
  Expression *pEVar6;
  mapped_type *pppEVar7;
  LocalSet *pLVar8;
  size_type sVar9;
  Type TVar10;
  LocalGet *value_00;
  _Base_ptr p_Var11;
  LocalSet **ppLVar12;
  undefined1 local_d0 [8];
  Iterator __end3;
  FindAll<wasm::LocalGet> gets;
  undefined1 local_80 [8];
  Iterator __begin3;
  Builder builder;
  LocalSet *local_48;
  Expression *value;
  SSAify *local_38;
  
  FindAll<wasm::LocalGet>::FindAll
            ((FindAll<wasm::LocalGet> *)&__end3.flexibleIterator,this->func->body);
  this_00 = &graph->locations;
  _Var5 = __end3.flexibleIterator;
  local_38 = this;
  do {
    if (_Var5._M_node ==
        (_Base_ptr)
        gets.list.super__Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>._M_impl.
        super__Vector_impl_data._M_start) {
      std::_Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_>::~_Vector_base
                ((_Vector_base<wasm::LocalGet_*,_std::allocator<wasm::LocalGet_*>_> *)
                 &__end3.flexibleIterator);
      return;
    }
    get = *(SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
            **)_Var5._M_node;
    this_02 = &LocalGraph::getSets(graph,(LocalGet *)get)->
               super_SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
    ;
    pSVar3 = local_38;
    p_Var1 = (_Base_ptr)(this_02->flexible)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    p_Var11 = p_Var1;
    if (p_Var1 == (_Base_ptr)0x0) {
      p_Var11 = (_Base_ptr)(this_02->fixed).super_FixedStorageBase<wasm::LocalSet_*,_2UL>.used;
    }
    if (p_Var11 != (_Base_ptr)0x0) {
      if (p_Var11 == (_Base_ptr)0x1) {
        p_Var11 = p_Var1;
        if (p_Var1 != (_Base_ptr)0x0) {
          p_Var11 = (this_02->flexible)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        }
        p_Var11 = p_Var11 + 1;
        if (p_Var1 == (_Base_ptr)0x0) {
          p_Var11 = (_Base_ptr)
                    &(this_02->fixed).super_FixedStorageBase<wasm::LocalSet_*,_2UL>.storage;
        }
        if (*(long *)p_Var11 == 0) {
          bVar4 = Function::isParam(local_38->func,
                                    *(Index *)((get->fixed).
                                               super_FixedStorageBase<wasm::LocalSet_*,_2UL>.storage
                                               ._M_elems + 1));
          if ((!bVar4) &&
             (bVar4 = LiteralUtils::canMakeZero
                                ((Type)(get->fixed).super_FixedStorageBase<wasm::LocalSet_*,_2UL>.
                                       storage._M_elems[0]), bVar4)) {
            this_01 = &(get->fixed).super_FixedStorageBase<wasm::LocalSet_*,_2UL>.storage;
            pEVar6 = LiteralUtils::makeZero((Type)this_01->_M_elems[0],local_38->module);
            local_80 = (undefined1  [8])get;
            pppEVar7 = std::
                       map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>
                       ::operator[](this_00,(key_type *)local_80);
            **pppEVar7 = pEVar6;
            bVar4 = wasm::Type::hasPredicate<&(wasm::Type::isRef()const)>((Type *)this_01);
            if (bVar4) {
              local_38->refinalize = true;
            }
          }
        }
        else {
          *(undefined4 *)
           ((get->fixed).super_FixedStorageBase<wasm::LocalSet_*,_2UL>.storage._M_elems + 1) =
               *(undefined4 *)(*(long *)p_Var11 + 0x10);
        }
      }
      else if (local_38->allowMerges == true) {
        index = addLocal(local_38,(Type)(get->fixed).super_FixedStorageBase<wasm::LocalSet_*,_2UL>.
                                        storage._M_elems[0]);
        value._4_4_ = *(Index *)((get->fixed).super_FixedStorageBase<wasm::LocalSet_*,_2UL>.storage.
                                 _M_elems + 1);
        *(Index *)((get->fixed).super_FixedStorageBase<wasm::LocalSet_*,_2UL>.storage._M_elems + 1)
             = index;
        __begin3.flexibleIterator._M_node = (_Base_ptr)pSVar3->module;
        __begin3.fixedIndex = 0;
        __begin3.parent._0_1_ =
             (this_02->flexible)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0;
        if ((bool)(char)__begin3.parent) {
          __begin3.usingFixed = false;
          __begin3._9_7_ = 0;
        }
        else {
          __begin3.fixedIndex =
               (size_t)(this_02->flexible)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        }
        local_80 = (undefined1  [8])this_02;
        SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
        ::end((Iterator *)local_d0,this_02);
        while (bVar4 = SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
                       ::
                       IteratorBase<wasm::SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::_Rb_tree_const_iterator<wasm::LocalSet_*>_>
                       ::operator!=((IteratorBase<wasm::SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::_Rb_tree_const_iterator<wasm::LocalSet_*>_>
                                     *)local_80,(Iterator *)local_d0), bVar4) {
          ppLVar12 = (LocalSet **)(__begin3.fixedIndex + 0x20);
          if ((char)__begin3.parent != '\0') {
            ppLVar12 = (((OrderedFixedStorage<wasm::LocalSet_*,_2UL> *)local_80)->
                       super_FixedStorageBase<wasm::LocalSet_*,_2UL>).storage._M_elems +
                       __begin3._8_8_;
          }
          pLVar2 = *ppLVar12;
          if (pLVar2 == (LocalSet *)0x0) {
            bVar4 = Function::isParam(local_38->func,value._4_4_);
            if (bVar4) {
              TVar10 = Function::getLocalType(local_38->func,value._4_4_);
              value_00 = MixedArena::alloc<wasm::LocalGet>
                                   ((MixedArena *)(__begin3.flexibleIterator._M_node + 0x10));
              value_00->index = value._4_4_;
              (value_00->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id
                   = TVar10.id;
              local_48 = Builder::makeLocalSet
                                   ((Builder *)&__begin3.flexibleIterator,index,
                                    (Expression *)value_00);
              std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
              emplace_back<wasm::Expression*>
                        ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)
                         &this->functionPrepends,(Expression **)&local_48);
            }
          }
          else {
            local_48 = (LocalSet *)pLVar2->value;
            pLVar8 = Builder::makeLocalTee
                               ((Builder *)&__begin3.flexibleIterator,index,(Expression *)local_48,
                                (Type)(get->fixed).super_FixedStorageBase<wasm::LocalSet_*,_2UL>.
                                      storage._M_elems[0]);
            pLVar2->value = (Expression *)pLVar8;
            sVar9 = std::
                    map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>
                    ::count(this_00,(key_type *)&local_48);
            if (sVar9 != 0) {
              pppEVar7 = std::
                         map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>
                         ::operator[](this_00,(key_type *)&local_48);
              if (*pppEVar7 != &pLVar2->value) {
                __assert_fail("graph.locations[value] == &set->value",
                              "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/SSAify.cpp"
                              ,0xb6,"void wasm::SSAify::computeGetsAndPhis(LocalGraph &)");
              }
              pppEVar7 = std::
                         map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>
                         ::operator[](this_00,(key_type *)&local_48);
              *pppEVar7 = &pLVar8->value;
            }
          }
          SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>
          ::
          IteratorBase<wasm::SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::_Rb_tree_const_iterator<wasm::LocalSet_*>_>
          ::operator++((IteratorBase<wasm::SmallSetBase<wasm::LocalSet_*,_2UL,_wasm::OrderedFixedStorage<wasm::LocalSet_*,_2UL>,_std::set<wasm::LocalSet_*,_std::less<wasm::LocalSet_*>,_std::allocator<wasm::LocalSet_*>_>_>,_std::_Rb_tree_const_iterator<wasm::LocalSet_*>_>
                        *)local_80);
        }
      }
    }
    _Var5._M_node = (_Base_ptr)&(_Var5._M_node)->_M_parent;
  } while( true );
}

Assistant:

void computeGetsAndPhis(LocalGraph& graph) {
    FindAll<LocalGet> gets(func->body);
    for (auto* get : gets.list) {
      auto& sets = graph.getSets(get);
      if (sets.size() == 0) {
        continue; // unreachable, ignore
      }
      if (sets.size() == 1) {
        // easy, just one set, use its index
        auto* set = *sets.begin();
        if (set) {
          get->index = set->index;
        } else {
          // no set, assign param or zero
          if (func->isParam(get->index)) {
            // leave it, it's fine
          } else if (LiteralUtils::canMakeZero(get->type)) {
            // zero it out
            (*graph.locations[get]) =
              LiteralUtils::makeZero(get->type, *module);
            // If we replace a local.get with a null then we are refining the
            // type that the parent receives to a bottom type.
            if (get->type.hasRef()) {
              refinalize = true;
            }
          } else {
            // No zero exists here, so this is a nondefaultable type. The
            // default won't be used anyhow, so this value does not really
            // matter and we have nothing to do.
          }
        }
        continue;
      }
      if (!allowMerges) {
        continue;
      }
      // more than 1 set, need a phi: a new local written to at each of the sets
      auto new_ = addLocal(get->type);
      auto old = get->index;
      get->index = new_;
      Builder builder(*module);
      // write to the local in each of our sets
      for (auto* set : sets) {
        if (set) {
          // a set exists, just add a tee of its value
          auto* value = set->value;
          auto* tee = builder.makeLocalTee(new_, value, get->type);
          set->value = tee;
          // the value may have been something we tracked the location
          // of. if so, update that, since we moved it into the tee
          if (graph.locations.count(value) > 0) {
            assert(graph.locations[value] == &set->value);
            graph.locations[value] = &tee->value;
          }
        } else {
          // this is a param or the zero init value.
          if (func->isParam(old)) {
            // we add a set with the proper
            // param value at the beginning of the function
            auto* set = builder.makeLocalSet(
              new_, builder.makeLocalGet(old, func->getLocalType(old)));
            functionPrepends.push_back(set);
          } else {
            // this is a zero init, so we don't need to do anything actually
          }
        }
      }
    }
  }